

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesGroupInfo.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XercesGroupInfo::XercesGroupInfo
          (XercesGroupInfo *this,uint groupNameId,uint groupNamespaceId,MemoryManager *manager)

{
  RefVectorOf<xercesc_4_0::SchemaElementDecl> *this_00;
  MemoryManager *manager_local;
  uint groupNamespaceId_local;
  uint groupNameId_local;
  XercesGroupInfo *this_local;
  
  XSerializable::XSerializable(&this->super_XSerializable);
  XMemory::XMemory((XMemory *)this);
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XercesGroupInfo_00536ed0;
  this->fCheckElementConsistency = true;
  this->fScope = 0xfffffffe;
  this->fNameId = groupNameId;
  this->fNamespaceId = groupNamespaceId;
  this->fContentSpec = (ContentSpecNode *)0x0;
  this->fElements = (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)0x0;
  this->fBaseGroup = (XercesGroupInfo *)0x0;
  this->fLocator = (XSDLocator *)0x0;
  this_00 = (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)XMemory::operator_new(0x30,manager);
  RefVectorOf<xercesc_4_0::SchemaElementDecl>::RefVectorOf(this_00,4,false,manager);
  this->fElements = this_00;
  return;
}

Assistant:

XercesGroupInfo::XercesGroupInfo(unsigned int groupNameId,
                                 unsigned int groupNamespaceId,
                                 MemoryManager* const manager)
    : fCheckElementConsistency(true)
    , fScope(Grammar::TOP_LEVEL_SCOPE)
    , fNameId(groupNameId)
    , fNamespaceId(groupNamespaceId)
    , fContentSpec(0)
    , fElements(0)
    , fBaseGroup(0)
    , fLocator(0)
{
    fElements = new (manager) RefVectorOf<SchemaElementDecl>(4, false, manager);
}